

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,string_type *s,
          string_format_info *fmt,source_location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  undefined8 *puVar4;
  char __c;
  string_type local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  source_location local_210;
  source_location local_198;
  source_location local_120;
  source_location local_a8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch(fmt->fmt) {
  case basic:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\"');
    escape_basic_string(&local_2f0,this,s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    __c = '\"';
    break;
  case literal:
    pcVar2 = (s->_M_dataplus)._M_p;
    local_2f0._M_dataplus._M_p._0_1_ = 10;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar2,pcVar2 + s->_M_string_length);
    if (_Var3._M_current != (s->_M_dataplus)._M_p + s->_M_string_length) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0xa0);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "toml::serializer: (non-multiline) literal string cannot have a newline","");
      source_location::source_location(&local_a8,loc);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"here","");
      format_error<>(&local_2b0,&local_230,&local_a8,&local_270);
      source_location::source_location(&local_198,loc);
      *puVar4 = &PTR__serialization_error_0053a8a8;
      puVar4[1] = puVar4 + 3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) {
        puVar4[3] = CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]);
        puVar4[4] = local_2b0.field_2._8_8_;
      }
      else {
        puVar4[1] = local_2b0._M_dataplus._M_p;
        puVar4[3] = CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]);
      }
      puVar4[2] = local_2b0._M_string_length;
      local_2b0._M_string_length = 0;
      local_2b0.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_198.file_name_.field_2;
      *(undefined4 *)(puVar4 + 0xb) = (undefined4)local_198.last_offset_;
      *(undefined4 *)((long)puVar4 + 0x5c) = local_198.last_offset_._4_4_;
      *(undefined4 *)(puVar4 + 0xc) = (undefined4)local_198.length_;
      *(undefined4 *)((long)puVar4 + 100) = local_198.length_._4_4_;
      *(undefined4 *)(puVar4 + 9) = (undefined4)local_198.last_line_;
      *(undefined4 *)((long)puVar4 + 0x4c) = local_198.last_line_._4_4_;
      *(undefined4 *)(puVar4 + 10) = (undefined4)local_198.last_column_;
      *(undefined4 *)((long)puVar4 + 0x54) = local_198.last_column_._4_4_;
      *(undefined4 *)(puVar4 + 7) = (undefined4)local_198.first_column_;
      *(undefined4 *)((long)puVar4 + 0x3c) = local_198.first_column_._4_4_;
      *(undefined4 *)(puVar4 + 8) = (undefined4)local_198.first_offset_;
      *(undefined4 *)((long)puVar4 + 0x44) = local_198.first_offset_._4_4_;
      puVar4[5] = local_198._0_8_;
      puVar4[6] = local_198.first_line_;
      puVar4[0xd] = puVar4 + 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198.file_name_._M_dataplus._M_p == paVar1) {
        puVar4[0xf] = CONCAT71(local_198.file_name_.field_2._M_allocated_capacity._1_7_,
                               local_198.file_name_.field_2._M_local_buf[0]);
        puVar4[0x10] = local_198.file_name_.field_2._8_8_;
      }
      else {
        puVar4[0xd] = local_198.file_name_._M_dataplus._M_p;
        puVar4[0xf] = CONCAT71(local_198.file_name_.field_2._M_allocated_capacity._1_7_,
                               local_198.file_name_.field_2._M_local_buf[0]);
      }
      puVar4[0xe] = local_198.file_name_._M_string_length;
      local_198.file_name_._M_string_length = 0;
      local_198.file_name_.field_2._M_local_buf[0] = '\0';
      puVar4[0x11] = local_198.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      puVar4[0x12] = local_198.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      puVar4[0x13] = local_198.line_str_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_198.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_198.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_198.file_name_._M_dataplus._M_p = (pointer)paVar1;
      __cxa_throw(puVar4,&serialization_error::typeinfo,serialization_error::~serialization_error);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'\'');
    __c = '\'';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(s->_M_dataplus)._M_p,s->_M_string_length);
    break;
  case multiline_basic:
    paVar1 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"\"\"\"","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (fmt->start_with_newline == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'\n');
    }
    escape_ml_basic_string(&local_2f0,this,s);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"\"\"\"","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    goto LAB_003d5781;
  case multiline_literal:
    paVar1 = &local_2f0.field_2;
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"\'\'\'","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (fmt->start_with_newline == true) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,'\n');
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(s->_M_dataplus)._M_p,s->_M_string_length);
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"\'\'\'","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
LAB_003d5781:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == &local_2f0.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  default:
    puVar4 = (undefined8 *)__cxa_allocate_exception(0xa0);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "[error] toml::serializer::operator()(string): invalid string_format value","");
    source_location::source_location(&local_120,loc);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"here","");
    format_error<>(&local_2d0,&local_250,&local_120,&local_290);
    source_location::source_location(&local_210,loc);
    *puVar4 = &PTR__serialization_error_0053a8a8;
    puVar4[1] = puVar4 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) {
      puVar4[3] = CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                           local_2d0.field_2._M_local_buf[0]);
      puVar4[4] = local_2d0.field_2._8_8_;
    }
    else {
      puVar4[1] = local_2d0._M_dataplus._M_p;
      puVar4[3] = CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                           local_2d0.field_2._M_local_buf[0]);
    }
    puVar4[2] = local_2d0._M_string_length;
    local_2d0._M_string_length = 0;
    local_2d0.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_210.file_name_.field_2;
    *(undefined4 *)(puVar4 + 0xb) = (undefined4)local_210.last_offset_;
    *(undefined4 *)((long)puVar4 + 0x5c) = local_210.last_offset_._4_4_;
    *(undefined4 *)(puVar4 + 0xc) = (undefined4)local_210.length_;
    *(undefined4 *)((long)puVar4 + 100) = local_210.length_._4_4_;
    *(undefined4 *)(puVar4 + 9) = (undefined4)local_210.last_line_;
    *(undefined4 *)((long)puVar4 + 0x4c) = local_210.last_line_._4_4_;
    *(undefined4 *)(puVar4 + 10) = (undefined4)local_210.last_column_;
    *(undefined4 *)((long)puVar4 + 0x54) = local_210.last_column_._4_4_;
    *(undefined4 *)(puVar4 + 7) = (undefined4)local_210.first_column_;
    *(undefined4 *)((long)puVar4 + 0x3c) = local_210.first_column_._4_4_;
    *(undefined4 *)(puVar4 + 8) = (undefined4)local_210.first_offset_;
    *(undefined4 *)((long)puVar4 + 0x44) = local_210.first_offset_._4_4_;
    puVar4[5] = local_210._0_8_;
    puVar4[6] = local_210.first_line_;
    puVar4[0xd] = puVar4 + 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.file_name_._M_dataplus._M_p == paVar1) {
      puVar4[0xf] = CONCAT71(local_210.file_name_.field_2._M_allocated_capacity._1_7_,
                             local_210.file_name_.field_2._M_local_buf[0]);
      puVar4[0x10] = local_210.file_name_.field_2._8_8_;
    }
    else {
      puVar4[0xd] = local_210.file_name_._M_dataplus._M_p;
      puVar4[0xf] = CONCAT71(local_210.file_name_.field_2._M_allocated_capacity._1_7_,
                             local_210.file_name_.field_2._M_local_buf[0]);
    }
    puVar4[0xe] = local_210.file_name_._M_string_length;
    local_210.file_name_._M_string_length = 0;
    local_210.file_name_.field_2._M_local_buf[0] = '\0';
    puVar4[0x11] = local_210.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    puVar4[0x12] = local_210.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    puVar4[0x13] = local_210.line_str_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_210.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_210.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_210.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_210.file_name_._M_dataplus._M_p = (pointer)paVar1;
    __cxa_throw(puVar4,&serialization_error::typeinfo,serialization_error::~serialization_error);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,__c);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(string_type s, const string_format_info& fmt, const source_location& loc) // {{{
    {
        string_type retval;
        switch(fmt.fmt)
        {
            case string_format::basic:
            {
                retval += char_type('"');
                retval += this->escape_basic_string(s);
                retval += char_type('"');
                return retval;
            }
            case string_format::literal:
            {
                if(std::find(s.begin(), s.end(), char_type('\n')) != s.end())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "(non-multiline) literal string cannot have a newline",
                        loc, "here"), loc);
                }
                retval += char_type('\'');
                retval += s;
                retval += char_type('\'');
                return retval;
            }
            case string_format::multiline_basic:
            {
                retval += string_conv<string_type>("\"\"\"");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }

                retval += this->escape_ml_basic_string(s);

                retval += string_conv<string_type>("\"\"\"");
                return retval;
            }
            case string_format::multiline_literal:
            {
                retval += string_conv<string_type>("'''");
                if(fmt.start_with_newline)
                {
                    retval += char_type('\n');
                }
                retval += s;
                retval += string_conv<string_type>("'''");
                return retval;
            }
            default:
            {
                throw serialization_error(format_error(
                    "[error] toml::serializer::operator()(string): "
                    "invalid string_format value", loc, "here"), loc);
            }
        }
    }